

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O0

block * gen_geneve(compiler_state_t *cstate,int vni)

{
  block *pbVar1;
  block *b1_00;
  slist *s0;
  slist *s;
  block *b1;
  block *b0;
  int vni_local;
  compiler_state_t *cstate_local;
  
  pbVar1 = gen_geneve4(cstate,vni);
  b1_00 = gen_geneve6(cstate,vni);
  gen_or(pbVar1,b1_00);
  s0 = gen_geneve_offsets(cstate);
  pbVar1 = gen_true(cstate);
  sappend(s0,pbVar1->stmts);
  pbVar1->stmts = s0;
  gen_and(b1_00,pbVar1);
  cstate->is_geneve = 1;
  return pbVar1;
}

Assistant:

struct block *
gen_geneve(compiler_state_t *cstate, int vni)
{
	struct block *b0, *b1;
	struct slist *s;

	b0 = gen_geneve4(cstate, vni);
	b1 = gen_geneve6(cstate, vni);

	gen_or(b0, b1);
	b0 = b1;

	/* Later filters should act on the payload of the Geneve frame,
	 * update all of the header pointers. Attach this code so that
	 * it gets executed in the event that the Geneve filter matches. */
	s = gen_geneve_offsets(cstate);

	b1 = gen_true(cstate);
	sappend(s, b1->stmts);
	b1->stmts = s;

	gen_and(b0, b1);

	cstate->is_geneve = 1;

	return b1;
}